

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assimp.cpp
# Opt level: O1

void aiGetMemoryRequirements(aiScene *pIn,aiMemoryInfo *in)

{
  Importer *this;
  
  if (pIn != (aiScene *)0x0) {
    if (((undefined8 *)pIn->mPrivate != (undefined8 *)0x0) &&
       (this = *pIn->mPrivate, this != (Importer *)0x0)) {
      Assimp::Importer::GetMemoryRequirements(this,in);
      return;
    }
    ReportSceneNotFoundError();
  }
  __assert_fail("nullptr != in",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/ScenePrivate.h"
                ,0x60,"const ScenePrivateData *Assimp::ScenePriv(const aiScene *)");
}

Assistant:

void aiGetMemoryRequirements(const C_STRUCT aiScene* pIn,
    C_STRUCT aiMemoryInfo* in)
{
    ASSIMP_BEGIN_EXCEPTION_REGION();

    // find the importer associated with this data
    const ScenePrivateData* priv = ScenePriv(pIn);
    if( !priv || !priv->mOrigImporter)  {
        ReportSceneNotFoundError();
        return;
    }

    return priv->mOrigImporter->GetMemoryRequirements(*in);
    ASSIMP_END_EXCEPTION_REGION(void);
}